

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::ExtractSubrange
          (RepeatedField<int> *this,int start,int num,int *elements)

{
  int index;
  int iVar1;
  LogMessage *pLVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  LogMessage local_f0;
  LogMessage local_b8;
  LogMessage local_80;
  ulong local_48;
  ulong local_40;
  int local_38;
  LogFinisher local_31;
  
  uVar5 = (ulong)(uint)num;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x563);
    pLVar2 = internal::LogMessage::operator<<(&local_f0,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar2);
    internal::LogMessage::~LogMessage(&local_f0);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x564);
    pLVar2 = internal::LogMessage::operator<<(&local_b8,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar2);
    internal::LogMessage::~LogMessage(&local_b8);
  }
  local_38 = num + start;
  if (this->current_size_ < local_38) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x565);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_80,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_80);
  }
  local_48 = uVar5;
  local_40 = (ulong)(uint)start;
  if (0 < num && elements != (int *)0x0) {
    uVar6 = 0;
    do {
      piVar3 = Get(this,start + (int)uVar6);
      elements[uVar6] = *piVar3;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  iVar4 = (int)local_48;
  if (0 < iVar4) {
    iVar1 = this->current_size_;
    uVar5 = local_40;
    if (local_38 < iVar1) {
      do {
        index = (int)uVar5;
        piVar3 = Get(this,iVar4 + index);
        Set(this,index,piVar3);
        iVar1 = this->current_size_;
        uVar5 = (ulong)(index + 1);
      } while (iVar4 + index + 1 < iVar1);
    }
    if (0 < this->current_size_) {
      this->current_size_ = iVar1 - iVar4;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}